

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poison.cc
# Opt level: O2

void * absl::lts_20240722::base_internal::InitializePoisonedPointerInternal(void)

{
  ulong length;
  void *pvVar1;
  
  length = sysconf(0x1e);
  pvVar1 = DirectMmap((void *)0x0,length,0,0x22,-1,0);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    pvVar1 = (void *)0xbad0bad0bad0bad0;
  }
  else {
    pvVar1 = (void *)((long)pvVar1 + (length >> 1));
  }
  return pvVar1;
}

Assistant:

void* InitializePoisonedPointerInternal() {
  const size_t block_size = GetPageSize();
#if defined(ABSL_HAVE_ADDRESS_SANITIZER)
  void* data = malloc(block_size);
  ASAN_POISON_MEMORY_REGION(data, block_size);
#elif defined(ABSL_HAVE_MEMORY_SANITIZER)
  void* data = malloc(block_size);
  __msan_poison(data, block_size);
#elif defined(ABSL_HAVE_MMAP)
  void* data = DirectMmap(nullptr, block_size, PROT_NONE,
                          MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
  if (data == MAP_FAILED) return GetBadPointerInternal();
#elif defined(_WIN32)
  void* data = VirtualAlloc(nullptr, block_size, MEM_RESERVE | MEM_COMMIT,
                            PAGE_NOACCESS);
  if (data == nullptr) return GetBadPointerInternal();
#else
  return GetBadPointerInternal();
#endif
  // Return the middle of the block so that dereferences before and after the
  // pointer will both crash.
  return static_cast<char*>(data) + block_size / 2;
}